

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetReference<void*>
          (BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,void **key,IsInstInlineCache ***value,int *index)

{
  long lVar1;
  hash_t hVar2;
  uint uVar3;
  DictionaryStats *this_00;
  uint depth;
  
  lVar1 = *(long *)this;
  depth = 0;
  if (lVar1 != 0) {
    hVar2 = PrimePolicy::ModPrime
                      ((uint)((ulong)*key >> 4) & 0x7fffffff,*(uint *)(this + 0x1c),
                       *(int *)(this + 0x2c));
    uVar3 = *(uint *)(lVar1 + (ulong)hVar2 * 4);
    depth = 0;
    if (-1 < (int)uVar3) {
      depth = 0;
      do {
        if (*(void **)(*(long *)(this + 8) + 0x10 + (ulong)uVar3 * 0x18) == *key) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_007cf85c;
        }
        depth = depth + 1;
        uVar3 = *(uint *)(*(long *)(this + 8) + (ulong)uVar3 * 0x18 + 8);
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar3 = 0xffffffff;
LAB_007cf85c:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  if (-1 < (int)uVar3) {
    *value = (IsInstInlineCache **)((ulong)uVar3 * 0x18 + *(long *)(this + 8));
    *index = uVar3;
  }
  return -1 < (int)uVar3;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }